

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

_Bool parse_color_value(char **begin,char *end,color_t *color)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  plutovg_color_t value;
  plutovg_color_t pStack_38;
  
  pbVar7 = (byte *)*begin;
  if (pbVar7 < end) {
    lVar5 = 0;
    do {
      pbVar6 = pbVar7 + 0xc;
      pcVar4 = "";
      if (lVar5 == 0xc) break;
      if (pbVar7[lVar5] != "currentColor"[lVar5]) {
        pbVar6 = pbVar7 + lVar5;
        pcVar4 = "currentColor" + lVar5;
        break;
      }
      lVar1 = lVar5 + 1;
      lVar5 = lVar5 + 1;
      pbVar6 = (byte *)end;
      pcVar4 = "currentColor" + ((long)end - (long)pbVar7);
    } while (pbVar7 + lVar1 != (byte *)end);
  }
  else {
    pbVar6 = pbVar7;
    pcVar4 = "currentColor";
  }
  if (*pcVar4 == '\0') {
    color->type = color_type_current;
    color->value = 0xff000000;
  }
  else {
    iVar2 = plutovg_color_parse(&pStack_38,(char *)pbVar7,(int)end - (int)pbVar7);
    if (iVar2 == 0) {
      return false;
    }
    color->type = color_type_fixed;
    uVar3 = plutovg_color_to_argb32(&pStack_38);
    color->value = uVar3;
    pbVar6 = pbVar7 + iVar2;
  }
  *begin = (char *)pbVar6;
  pbVar7 = pbVar6;
  if (pbVar6 < end) {
    do {
      pbVar7 = pbVar6;
      if ((0x20 < (ulong)*pbVar6) || ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) break;
      pbVar6 = pbVar6 + 1;
      pbVar7 = (byte *)end;
    } while (pbVar6 != (byte *)end);
  }
  *begin = (char *)pbVar7;
  return true;
}

Assistant:

static bool parse_color_value(const char** begin, const char* end, color_t* color)
{
    const char* it = *begin;
    if(skip_string(&it, end, "currentColor")) {
        color->type = color_type_current;
        color->value = 0xFF000000;
    } else {
        plutovg_color_t value;
        int length = plutovg_color_parse(&value, it, end - it);
        if(length == 0)
            return false;
        color->type = color_type_fixed;
        color->value = plutovg_color_to_argb32(&value);
        it += length;
    }

    *begin = it;
    skip_ws(begin, end);
    return true;
}